

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::OptUtils::FunctionRefReplacer::create(FunctionRefReplacer *this)

{
  FunctionRefReplacer *this_00;
  long in_RSI;
  _Any_data local_40;
  code *local_30;
  
  this_00 = (FunctionRefReplacer *)operator_new(0x150);
  std::function<void_(wasm::Name_&)>::function
            ((function<void_(wasm::Name_&)> *)&local_40,
             (function<void_(wasm::Name_&)> *)(in_RSI + 0x130));
  FunctionRefReplacer(this_00,(MaybeReplace *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionRefReplacer>(maybeReplace);
  }